

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QString * __thiscall
QAccessibleDisplay::text(QString *__return_storage_ptr__,QAccessibleDisplay *this,Text t)

{
  ulong uVar1;
  double dVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  ulong uVar4;
  QArrayData *pQVar5;
  Data *pDVar6;
  qsizetype qVar7;
  Data *pDVar8;
  char16_t *pcVar9;
  char cVar10;
  TextFormat TVar11;
  int iVar12;
  QWidget *pQVar13;
  long lVar14;
  QLabel *this_00;
  QProgressBar *this_01;
  QArrayData *pQVar15;
  QLCDNumber *this_02;
  QStatusBar *this_03;
  long in_FS_OFFSET;
  QAnyStringView QVar16;
  undefined1 *local_88;
  undefined1 *puStack_80;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  local_58.d.size = 0;
  if (t == Value) {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar14 = QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
    if (lVar14 != 0) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_01 = (QProgressBar *)QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
      iVar12 = QProgressBar::value(this_01);
LAB_0052e455:
      QString::number((int)&local_78,iVar12);
LAB_0052e469:
      pcVar9 = local_58.d.ptr;
      pQVar15 = &(local_58.d.d)->super_QArrayData;
      qVar7 = local_78.d.size;
      local_58.d.d = local_78.d.d;
      local_58.d.ptr = local_78.d.ptr;
      local_78.d.ptr = pcVar9;
      local_78.d.size = local_58.d.size;
      local_58.d.size = qVar7;
LAB_0052e48d:
      local_78.d.d = (Data *)pQVar15;
      if (pQVar15 != (QArrayData *)0x0) {
        LOCK();
        (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar15,2,0x10);
        }
      }
    }
  }
  else if (t == Name) {
    pQVar13 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
    QWidget::accessibleName(&local_78,pQVar13);
    pcVar9 = local_58.d.ptr;
    pDVar8 = local_58.d.d;
    qVar7 = local_78.d.size;
    pDVar6 = local_78.d.d;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar6;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.ptr = pcVar9;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar7;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
    if (local_58.d.size == 0) {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      lVar14 = QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      if (lVar14 == 0) {
        lVar14 = QMetaObject::cast((QObject *)&QLCDNumber::staticMetaObject);
        (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
        if (lVar14 != 0) {
          this_02 = (QLCDNumber *)QMetaObject::cast((QObject *)&QLCDNumber::staticMetaObject);
          iVar12 = QLCDNumber::digitCount(this_02);
          if (iVar12 == 0) {
            iVar12 = QLCDNumber::intValue(this_02);
            goto LAB_0052e455;
          }
          dVar2 = QLCDNumber::value(this_02);
          QString::number(dVar2,(char)&local_78,0x67);
          goto LAB_0052e469;
        }
        lVar14 = QMetaObject::cast((QObject *)&QStatusBar::staticMetaObject);
        if (lVar14 != 0) {
          (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
          this_03 = (QStatusBar *)QMetaObject::cast((QObject *)&QStatusBar::staticMetaObject);
          QStatusBar::currentMessage(__return_storage_ptr__,this_03);
          goto LAB_0052e5fe;
        }
      }
      else {
        this_00 = (QLabel *)QMetaObject::cast((QObject *)&QLabel::staticMetaObject);
        QLabel::text(&local_78,this_00);
        pcVar9 = local_58.d.ptr;
        pDVar8 = local_58.d.d;
        qVar7 = local_78.d.size;
        pDVar6 = local_78.d.d;
        local_78.d.d = local_58.d.d;
        local_58.d.d = pDVar6;
        local_58.d.ptr = local_78.d.ptr;
        local_78.d.ptr = pcVar9;
        local_78.d.size = local_58.d.size;
        local_58.d.size = qVar7;
        if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
          }
        }
        TVar11 = QLabel::textFormat(this_00);
        if (TVar11 == RichText) {
LAB_0052e380:
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          QTextDocument::QTextDocument((QTextDocument *)&local_88,(QObject *)0x0);
          QTextDocument::setHtml((QString *)&local_88);
          QTextDocument::toPlainText();
          pcVar9 = local_58.d.ptr;
          pDVar8 = local_58.d.d;
          qVar7 = local_78.d.size;
          pDVar6 = local_78.d.d;
          local_78.d.d = local_58.d.d;
          local_58.d.d = pDVar6;
          local_58.d.ptr = local_78.d.ptr;
          local_78.d.ptr = pcVar9;
          local_78.d.size = local_58.d.size;
          local_58.d.size = qVar7;
          if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
            }
          }
          QTextDocument::~QTextDocument((QTextDocument *)&local_88);
        }
        else {
          TVar11 = QLabel::textFormat(this_00);
          if (TVar11 == AutoText) {
            QVar16.m_size = local_58.d.size | 0x8000000000000000;
            QVar16.field_0.m_data_utf16 = local_58.d.ptr;
            cVar10 = Qt::mightBeRichText(QVar16);
            if (cVar10 != '\0') goto LAB_0052e380;
          }
        }
        pQVar13 = QLabel::buddy(this_00);
        if (pQVar13 != (QWidget *)0x0) {
          qt_accStripAmp(&local_78,&local_58);
          aVar3.m_data_utf16 = local_58.d.ptr;
          uVar1 = local_58.d.size;
          local_58.d.ptr = local_78.d.ptr;
          local_58.d.size = local_78.d.size;
          pQVar15 = &(local_58.d.d)->super_QArrayData;
          local_78.d.ptr = aVar3.m_data_utf16;
          local_78.d.size = uVar1;
          local_58.d.d = (Data *)&(local_78.d.d)->super_QArrayData;
          goto LAB_0052e48d;
        }
      }
    }
  }
  if (local_58.d.size == 0) {
    QAccessibleWidget::text(&local_78,&this->super_QAccessibleWidget,t);
    pcVar9 = local_58.d.ptr;
    pDVar8 = local_58.d.d;
    qVar7 = local_78.d.size;
    pDVar6 = local_78.d.d;
    pQVar15 = &(local_58.d.d)->super_QArrayData;
    aVar3.m_data = local_58.d.ptr;
    uVar4 = local_58.d.size;
    pQVar5 = &(local_78.d.d)->super_QArrayData;
    local_58.d.ptr = local_78.d.ptr;
    local_78.d.d = local_58.d.d;
    local_58.d.d = pDVar6;
    uVar1 = local_78.d.size;
    local_78.d.ptr = pcVar9;
    local_78.d.size = local_58.d.size;
    local_58.d.size = qVar7;
    if (&pDVar8->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&pDVar8->super_QArrayData,2,0x10);
      }
    }
  }
  qVar7 = local_58.d.size;
  pcVar9 = local_58.d.ptr;
  pDVar6 = local_58.d.d;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar6;
  (__return_storage_ptr__->d).ptr = pcVar9;
  local_58.d.size = 0;
  (__return_storage_ptr__->d).size = qVar7;
LAB_0052e5fe:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleDisplay::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = widget()->accessibleName();
        if (str.isEmpty()) {
            if (false) {
#if QT_CONFIG(label)
            } else if (qobject_cast<QLabel*>(object())) {
                QLabel *label = qobject_cast<QLabel*>(object());
                str = label->text();
#ifndef QT_NO_TEXTHTMLPARSER
                if (label->textFormat() == Qt::RichText
                    || (label->textFormat() == Qt::AutoText && Qt::mightBeRichText(str))) {
                    QTextDocument doc;
                    doc.setHtml(str);
                    str = doc.toPlainText();
                }
#endif
#ifndef QT_NO_SHORTCUT
                if (label->buddy())
                    str = qt_accStripAmp(str);
#endif
#endif // QT_CONFIG(label)
#if QT_CONFIG(lcdnumber)
            } else if (qobject_cast<QLCDNumber*>(object())) {
                QLCDNumber *l = qobject_cast<QLCDNumber*>(object());
                if (l->digitCount())
                    str = QString::number(l->value());
                else
                    str = QString::number(l->intValue());
#endif
#if QT_CONFIG(statusbar)
            } else if (qobject_cast<QStatusBar*>(object())) {
                return qobject_cast<QStatusBar*>(object())->currentMessage();
#endif
            }
        }
        break;
    case QAccessible::Value:
#if QT_CONFIG(progressbar)
        if (qobject_cast<QProgressBar*>(object()))
            str = QString::number(qobject_cast<QProgressBar*>(object())->value());
#endif
        break;
    default:
        break;
    }
    if (str.isEmpty())
        str = QAccessibleWidget::text(t);
    return str;
}